

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skins.cpp
# Opt level: O1

void __thiscall CSkins::SaveSkinfile(CSkins *this,char *pSaveSkinName)

{
  uint uVar1;
  IStorage *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  byte bVar4;
  long lVar5;
  int PartIndex;
  long lVar6;
  long in_FS_OFFSET;
  CJsonWriter Writer;
  char aBuf [512];
  CJsonWriter local_268;
  char local_238 [512];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  str_format(local_238,0x200,"skins/%s.json",pSaveSkinName);
  pIVar2 = ((this->super_CComponent).m_pClient)->m_pStorage;
  iVar3 = (*(pIVar2->super_IInterface)._vptr_IInterface[4])(pIVar2,local_238,2,0,0,0,0,0);
  if ((IOHANDLE)CONCAT44(extraout_var,iVar3) != (IOHANDLE)0x0) {
    CJsonWriter::CJsonWriter(&local_268,(IOHANDLE)CONCAT44(extraout_var,iVar3));
    CJsonWriter::BeginObject(&local_268);
    CJsonWriter::WriteAttribute(&local_268,"skin");
    CJsonWriter::BeginObject(&local_268);
    lVar6 = 0;
    do {
      if (*ms_apSkinVariables[lVar6] != '\0') {
        CJsonWriter::WriteAttribute(&local_268,ms_apSkinPartNames[lVar6]);
        CJsonWriter::BeginObject(&local_268);
        CJsonWriter::WriteAttribute(&local_268,"filename");
        CJsonWriter::WriteStrValue(&local_268,ms_apSkinVariables[lVar6]);
        iVar3 = *ms_apUCCVariables[lVar6];
        CJsonWriter::WriteAttribute(&local_268,"custom_colors");
        CJsonWriter::WriteBoolValue(&local_268,iVar3 != 0);
        if (iVar3 != 0) {
          bVar4 = 0x10;
          lVar5 = 0;
          do {
            iVar3 = *ms_apColorVariables[lVar6];
            CJsonWriter::WriteAttribute(&local_268,*(char **)((long)ms_apColorComponents + lVar5));
            CJsonWriter::WriteIntValue(&local_268,iVar3 >> (bVar4 & 0x1f) & 0xff);
            bVar4 = bVar4 - 8;
            lVar5 = lVar5 + 8;
          } while (lVar5 != 0x18);
          if (lVar6 == 1) {
            uVar1 = *ms_apColorVariables[1];
            CJsonWriter::WriteAttribute(&local_268,"alp");
            CJsonWriter::WriteIntValue(&local_268,uVar1 >> 0x18);
          }
        }
        CJsonWriter::EndObject(&local_268);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    CJsonWriter::EndObject(&local_268);
    CJsonWriter::EndObject(&local_268);
    AddSkin(this,pSaveSkinName);
    CJsonWriter::~CJsonWriter(&local_268);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CSkins::SaveSkinfile(const char *pSaveSkinName)
{
	char aBuf[IO_MAX_PATH_LENGTH];
	str_format(aBuf, sizeof(aBuf), "skins/%s.json", pSaveSkinName);
	IOHANDLE File = Storage()->OpenFile(aBuf, IOFLAG_WRITE, IStorage::TYPE_SAVE);
	if(!File)
		return;

	CJsonWriter Writer(File);

	Writer.BeginObject();
	Writer.WriteAttribute("skin");
	Writer.BeginObject();
	for(int PartIndex = 0; PartIndex < NUM_SKINPARTS; PartIndex++)
	{
		if(!ms_apSkinVariables[PartIndex][0])
			continue;

		// part start
		Writer.WriteAttribute(ms_apSkinPartNames[PartIndex]);
		Writer.BeginObject();
		{
			Writer.WriteAttribute("filename");
			Writer.WriteStrValue(ms_apSkinVariables[PartIndex]);

			const bool CustomColors = *ms_apUCCVariables[PartIndex];
			Writer.WriteAttribute("custom_colors");
			Writer.WriteBoolValue(CustomColors);

			if(CustomColors)
			{
				for(int c = 0; c < NUM_COLOR_COMPONENTS-1; c++)
				{
					int Val = (*ms_apColorVariables[PartIndex] >> (2-c)*8) & 0xff;
					Writer.WriteAttribute(ms_apColorComponents[c]);
					Writer.WriteIntValue(Val);
				}
				if(PartIndex == SKINPART_MARKING)
				{
					int Val = (*ms_apColorVariables[PartIndex] >> 24) & 0xff;
					Writer.WriteAttribute(ms_apColorComponents[3]);
					Writer.WriteIntValue(Val);
				}
			}
		}
		Writer.EndObject();
	}
	Writer.EndObject();
	Writer.EndObject();

	// add new skin to the skin list
	AddSkin(pSaveSkinName);
}